

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcStatesStatesFixedScaling
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,int *child1States,float *child1TransMat,
          int *child2States,float *child2TransMat,float *scaleFactors,int startPattern,
          int endPattern)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int i;
  float scaleFactor;
  int w;
  int state2;
  int state1;
  int k;
  int v;
  int l;
  float *child2TransMat_local;
  int *child2States_local;
  float *child1TransMat_local;
  int *child1States_local;
  float *destP_local;
  BeagleCPUImpl<float,_1,_0> *this_local;
  
  for (l = 0; l < this->kCategoryCount; l = l + 1) {
    v = l * this->kPartialsPaddedStateCount * this->kPatternCount +
        this->kPartialsPaddedStateCount * startPattern;
    for (k = startPattern; k < endPattern; k = k + 1) {
      iVar2 = child1States[k];
      iVar3 = child2States[k];
      w = l * this->kMatrixSize;
      fVar1 = scaleFactors[k];
      for (i = 0; i < this->kStateCount; i = i + 1) {
        destP[v] = (child1TransMat[w + iVar2] * child2TransMat[w + iVar3]) / fVar1;
        v = v + 1;
        w = this->kTransPaddedStateCount + w;
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesStatesFixedScaling(REALTYPE* destP,
                                                                     const int* child1States,
                                                                     const REALTYPE* child1TransMat,
                                                                     const int* child2States,
                                                                     const REALTYPE* child2TransMat,
                                                                     const REALTYPE* scaleFactors,
                                                                     int startPattern,
                                                                     int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
    int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        for (int k = startPattern; k < endPattern; k++) {
            const int state1 = child1States[k];
            const int state2 = child2States[k];
            int w = l * kMatrixSize;
            REALTYPE scaleFactor = scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                destP[v] = child1TransMat[w + state1] *
                           child2TransMat[w + state2] / scaleFactor;
                v++;

                w += kTransPaddedStateCount;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    destP[v] = 0.0;
                    v++;
                }
            }
        }
    }
}